

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetChatMember(TgTypeParser *this,ptree *data)

{
  type_conflict tVar1;
  type_conflict1 tVar2;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar3;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  allocator local_39;
  type local_38;
  
  std::make_shared<TgBot::ChatMember>();
  std::__cxx11::string::string((string *)&local_70,"user",&local_39);
  tryParseJson<TgBot::User>
            ((TgTypeParser *)&local_38,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  std::__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>::operator=
            (*(__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> **)this,
             (__shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"status",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_38,in_RDX,&local_70,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x10),(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"until_date",0x2e);
  local_38._M_dataplus._M_p = (pointer)0x0;
  tVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<unsigned_long>(in_RDX,&local_70,(unsigned_long *)&local_38);
  *(type_conflict1 *)(*(long *)this + 0x30) = tVar2;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_be_edited",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x38) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_change_info",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x39) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_post_messages",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x3a) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_edit_messages",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x3b) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_delete_messages",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x3c) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_invite_users",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x3d) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_restrict_members",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x3e) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_pin_messages",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x3f) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_promote_messages",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x40) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_send_messages",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x41) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_send_media_messages",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x42) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_send_other_messages",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x43) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_70,"can_add_web_page_previews",0x2e);
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffffffffff00;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&local_70,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 0x44) = tVar1;
  std::__cxx11::string::~string((string *)&local_70);
  PVar3.super___shared_ptr<TgBot::ChatMember,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<TgBot::ChatMember,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar3.super___shared_ptr<TgBot::ChatMember,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ChatMember::Ptr TgTypeParser::parseJsonAndGetChatMember(const boost::property_tree::ptree& data) const {
    auto result(make_shared<ChatMember>());
    result->user = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "user");
    result->status = data.get("status", "");
    result->untilDate = data.get<uint64_t>("until_date", 0);
    result->canBeEdited = data.get<bool>("can_be_edited", false);
    result->canChangeInfo = data.get<bool>("can_change_info", false);
    result->canPostMessages = data.get<bool>("can_post_messages", false);
    result->canEditMessages = data.get<bool>("can_edit_messages", false);
    result->canDeleteMessages = data.get<bool>("can_delete_messages", false);
    result->canInviteUsers = data.get<bool>("can_invite_users", false);
    result->canRestrictMembers = data.get<bool>("can_restrict_members", false);
    result->canPinMessages = data.get<bool>("can_pin_messages", false);
    result->canPromoteMembers = data.get<bool>("can_promote_messages", false);
    result->canSendMessages = data.get<bool>("can_send_messages", false);
    result->canSendMediaMessages = data.get<bool>("can_send_media_messages", false);
    result->canSendOtherMessages = data.get<bool>("can_send_other_messages", false);
    result->canAddWebPagePreviews = data.get<bool>("can_add_web_page_previews", false);
    return result;
}